

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O2

void __thiscall Memory::LargeHeapBlock::CapturePageHeapFreeStack(LargeHeapBlock *this)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  PageHeapData *pPVar4;
  StackBackTrace *pSVar5;
  undefined8 *in_FS_OFFSET;
  
  pPVar4 = this->pageHeapData;
  if ((pPVar4 != (PageHeapData *)0x0) && (pPVar4->pageHeapMode != PageHeapModeOff)) {
    if (pPVar4->pageHeapFreeStack != (StackBackTrace *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                         ,0x993,"(this->pageHeapData->pageHeapFreeStack == nullptr)",
                         "this->pageHeapData->pageHeapFreeStack == nullptr");
      if (!bVar3) goto LAB_0026a49f;
      *puVar1 = 0;
      pPVar4 = this->pageHeapData;
    }
    if (pPVar4->pageHeapAllocStack == (StackBackTrace *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                         ,0x994,"(this->pageHeapData->pageHeapAllocStack != nullptr)",
                         "this->pageHeapData->pageHeapAllocStack != nullptr");
      if (!bVar3) {
LAB_0026a49f:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar1 = 0;
      pPVar4 = this->pageHeapData;
    }
    if (pPVar4->pageHeapFreeStack != (StackBackTrace *)0x0) {
      StackBackTrace::Capture(pPVar4->pageHeapFreeStack,0);
      return;
    }
    pSVar5 = StackBackTrace::Capture<Memory::NoThrowHeapAllocator>
                       ((NoThrowHeapAllocator *)&NoThrowHeapAllocator::Instance,0,0x20);
    this->pageHeapData->pageHeapFreeStack = pSVar5;
  }
  return;
}

Assistant:

void
LargeHeapBlock::CapturePageHeapFreeStack()
{
#ifdef STACK_BACK_TRACE
    if (this->InPageHeapMode()) // pageheap can be enabled only for some of the buckets
    {
        // These asserts are true because explicit free is disallowed in
        // page heap mode. If they weren't, we'd have to modify the asserts
        Assert(this->pageHeapData->pageHeapFreeStack == nullptr);
        Assert(this->pageHeapData->pageHeapAllocStack != nullptr);

        if (this->pageHeapData->pageHeapFreeStack != nullptr)
        {
            this->pageHeapData->pageHeapFreeStack->Capture(Recycler::s_numFramesToSkipForPageHeapFree);
        }
        else
        {
            this->pageHeapData->pageHeapFreeStack = StackBackTrace::Capture(&NoThrowHeapAllocator::Instance,
                Recycler::s_numFramesToSkipForPageHeapFree, Recycler::s_numFramesToCaptureForPageHeap);
        }
    }
#endif
}